

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

size_t art_serialize(art_t *art,char *buf)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  long lVar6;
  size_t __n;
  long lVar7;
  char *__dest;
  
  if ((buf != (char *)0x0) && (art->first_free[1] == art->capacities[1])) {
    lVar7 = 3;
    do {
      lVar6 = lVar7;
      if (lVar6 == 7) break;
      lVar7 = lVar6 + 1;
    } while (art->first_free[lVar6 + -1] == art->first_free[lVar6 + 5]);
    if (4 < lVar6 - 2U) {
      *(art_ref_t *)buf = art->root;
      uVar1 = art->capacities[1];
      uVar2 = art->capacities[2];
      uVar3 = art->capacities[3];
      uVar4 = art->capacities[4];
      uVar5 = art->capacities[5];
      *(uint64_t *)(buf + 8) = art->capacities[0];
      *(uint64_t *)(buf + 0x10) = uVar1;
      *(uint64_t *)(buf + 0x18) = uVar2;
      *(uint64_t *)(buf + 0x20) = uVar3;
      *(uint64_t *)(buf + 0x28) = uVar4;
      *(uint64_t *)(buf + 0x30) = uVar5;
      __dest = buf + 0x38;
      lVar7 = 0;
      do {
        if (art->capacities[lVar7 + 1] != 0) {
          __n = art->capacities[lVar7 + 1] * ART_NODE_SIZES[lVar7 + 1];
          memcpy(__dest,art->nodes[lVar7 + 1],__n);
          __dest = __dest + __n;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 5);
      return (long)__dest - (long)buf;
    }
  }
  return 0;
}

Assistant:

size_t art_serialize(const art_t *art, char *buf) {
    if (buf == NULL) {
        return 0;
    }
    if (!art_is_shrunken(art)) {
        return 0;
    }
    const char *initial_buf = buf;

    // Root.
    memcpy(buf, &art->root, sizeof(art->root));
    buf += sizeof(art->root);

    // Node counts.
    memcpy(buf, art->capacities, sizeof(art->capacities));
    buf += sizeof(art->capacities);

    // Alignment for leaves. The rest of the nodes are aligned the same way.
    size_t align_bytes =
        CROARING_ART_ALIGN_SIZE_RELATIVE(buf, initial_buf, alignof(art_leaf_t));
    memset(buf, 0, align_bytes);
    buf += align_bytes;

    for (art_typecode_t t = CROARING_ART_MIN_TYPE; t <= CROARING_ART_MAX_TYPE;
         ++t) {
        if (art->capacities[t] > 0) {
            size_t size = art->capacities[t] * ART_NODE_SIZES[t];
            memcpy(buf, art->nodes[t], size);
            buf += size;
        }
    }

    return buf - initial_buf;
}